

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall pg::Game::parse_solution(Game *this,istream *in)

{
  undefined4 uVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  istream *piVar5;
  runtime_error *prVar6;
  long *plVar7;
  int local_244;
  undefined1 local_240 [4];
  int str;
  undefined1 local_230 [16];
  undefined1 local_220 [24];
  undefined1 local_208 [4];
  int w;
  int local_1f8;
  undefined4 local_1f4;
  int ident;
  string token;
  stringstream ss;
  string local_38 [8];
  string line;
  istream *in_local;
  Game *this_local;
  
  line.field_2._8_8_ = in;
  std::__cxx11::string::string(local_38);
  do {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)line.field_2._8_8_,local_38);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&piVar5->_vptr_basic_istream +
                              (long)piVar5->_vptr_basic_istream[-3]));
    if (!bVar2) {
      std::__cxx11::string::~string(local_38);
      return;
    }
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(token.field_2._M_local_buf + 8),local_38,_Var4);
    std::__cxx11::string::string((string *)&ident);
    piVar5 = std::operator>>((istream *)((long)&token.field_2 + 8),(string *)&ident);
    bVar3 = std::ios::operator!((ios *)((long)&piVar5->_vptr_basic_istream +
                                       (long)piVar5->_vptr_basic_istream[-3]));
    if ((bVar3 & 1) == 0) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ident,"paritysol");
      if (bVar2) {
        local_1f4 = 2;
      }
      else {
        local_1f8 = std::__cxx11::stoi((string *)&ident,(size_t *)0x0,10);
        if ((local_1f8 < 0) || (this->n_vertices <= (long)local_1f8)) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"node index out of bounds");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bitset::operator[]((bitset *)local_208,(size_t)&this->solved);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_208);
        if (bVar2) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"node already solved");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        plVar7 = (long *)std::istream::operator>>
                                   ((void *)((long)&token.field_2 + 8),(int *)(local_220 + 0x14));
        bVar3 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
        if ((bVar3 & 1) != 0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"missing winner");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((local_220._20_4_ != 0) && (local_220._20_4_ != 1)) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"invalid winner");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bitset::operator[]((bitset *)local_220,(size_t)&this->solved);
        bitset::reference::operator=((reference *)local_220,true);
        bVar2 = local_220._20_4_ != 0;
        bitset::operator[]((bitset *)local_230,(size_t)&this->winner);
        bitset::reference::operator=((reference *)local_230,bVar2);
        uVar1 = local_220._20_4_;
        bitset::operator[]((bitset *)local_240,(size_t)&this->_owner);
        bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_240);
        if (uVar1 == (uint)bVar2) {
          plVar7 = (long *)std::istream::operator>>((void *)((long)&token.field_2 + 8),&local_244);
          bVar3 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
          if ((bVar3 & 1) != 0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"missing strategy for winning node");
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this->strategy[local_1f8] = local_244;
        }
        else {
          this->strategy[local_1f8] = -1;
        }
        local_1f4 = 0;
      }
    }
    else {
      local_1f4 = 2;
    }
    std::__cxx11::string::~string((string *)&ident);
    std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  } while( true );
}

Assistant:

void
Game::parse_solution(std::istream &in)
{
    string line;
    while (getline(in, line)) {
        stringstream ss(line);
        string token;

        // ignore empty line
        if (!(ss >> token)) continue;

        // ignore line with "paritysol"
        if (token == "paritysol") continue;

        // get node
        int ident = stoi(token);
        if (ident < 0 || ident >= n_vertices) {
            throw std::runtime_error("node index out of bounds");
        }

        if (solved[ident]) throw std::runtime_error("node already solved");

        // parse winner
        int w;
        if (!(ss >> w)) throw std::runtime_error("missing winner");
        if (w!= 0 && w!= 1) throw std::runtime_error("invalid winner");

        // set winner
        solved[ident] = true;
        winner[ident] = w;

        // parse strategy
        if (w == _owner[ident]) {
            int str;
            if (!(ss >> str)) throw std::runtime_error("missing strategy for winning node");
            // if (!has_edge(ident, str)) throw std::runtime_error("strategy not successor of node");
            // actually this is already checked by the verifier
            strategy[ident] = str;
        } else {
            strategy[ident] = -1;
        }
    }
}